

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

_Bool rsa2_verify(ssh_key *key,ptrlen sig,ptrlen data)

{
  byte bVar1;
  ptrlen pl;
  _Bool _Var2;
  byte bVar3;
  byte bVar4;
  ssh_hashalg *halg_00;
  size_t sVar5;
  ulong nbytes_00;
  mp_int *base;
  mp_int *x;
  uchar *b;
  ptrlen pVar6;
  ulong local_e8;
  size_t i;
  uchar *bytes;
  uint diff;
  void *local_c0;
  void *local_b8;
  size_t nbytes;
  ssh_hashalg *halg;
  ssh2_rsa_extra *extra;
  mp_int *out;
  mp_int *in;
  ptrlen in_pl;
  ptrlen type;
  BinarySource src [1];
  RSAKey *rsa;
  ssh_key *key_local;
  ptrlen data_local;
  ptrlen sig_local;
  
  halg_00 = rsa2_hash_alg_for_flags(*key->vt->extra,(char **)0x0);
  sVar5 = mp_get_nbits((mp_int *)key[-7].vt);
  nbytes_00 = sVar5 + 7 >> 3;
  sVar5 = rsa_pkcs1_length_of_fixed_parts(halg_00);
  if (sVar5 <= nbytes_00) {
    BinarySource_INIT__((BinarySource *)&type.len,sig);
    pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    local_c0 = pVar6.ptr;
    local_b8 = (void *)pVar6.len;
    type.ptr = local_b8;
    pVar6 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    if ((*(int *)(src[0]._24_8_ + 0x18) == 0) &&
       (pl.len = (size_t)type.ptr, pl.ptr = local_c0, _Var2 = ptrlen_eq_string(pl,key->vt->ssh_id),
       _Var2)) {
      base = mp_from_bytes_be(pVar6);
      x = mp_modpow(base,(mp_int *)key[-6].vt,(mp_int *)key[-7].vt);
      mp_free(base);
      bVar4 = 0;
      b = rsa_pkcs1_signature_string(nbytes_00,halg_00,data);
      for (local_e8 = 0; local_e8 < nbytes_00; local_e8 = local_e8 + 1) {
        bVar1 = b[(nbytes_00 - 1) - local_e8];
        bVar3 = mp_get_byte(x,local_e8);
        bVar4 = bVar1 ^ bVar3 | bVar4;
      }
      smemclr(b,nbytes_00);
      safefree(b);
      mp_free(x);
      return bVar4 == 0;
    }
  }
  return false;
}

Assistant:

static bool rsa2_verify(ssh_key *key, ptrlen sig, ptrlen data)
{
    RSAKey *rsa = container_of(key, RSAKey, sshk);
    BinarySource src[1];
    ptrlen type, in_pl;
    mp_int *in, *out;

    const struct ssh2_rsa_extra *extra =
        (const struct ssh2_rsa_extra *)key->vt->extra;

    const ssh_hashalg *halg = rsa2_hash_alg_for_flags(extra->signflags, NULL);

    /* Start by making sure the key is even long enough to encode a
     * signature. If not, everything fails to verify. */
    size_t nbytes = (mp_get_nbits(rsa->modulus) + 7) / 8;
    if (nbytes < rsa_pkcs1_length_of_fixed_parts(halg))
        return false;

    BinarySource_BARE_INIT_PL(src, sig);
    type = get_string(src);
    /*
     * RFC 4253 section 6.6: the signature integer in an ssh-rsa
     * signature is 'without lengths or padding'. That is, we _don't_
     * expect the usual leading zero byte if the topmost bit of the
     * first byte is set. (However, because of the possibility of
     * BUG_SSH2_RSA_PADDING at the other end, we tolerate it if it's
     * there.) So we can't use get_mp_ssh2, which enforces that
     * leading-byte scheme; instead we use get_string and
     * mp_from_bytes_be, which will tolerate anything.
     */
    in_pl = get_string(src);
    if (get_err(src) || !ptrlen_eq_string(type, key->vt->ssh_id))
        return false;

    in = mp_from_bytes_be(in_pl);
    out = mp_modpow(in, rsa->exponent, rsa->modulus);
    mp_free(in);

    unsigned diff = 0;

    unsigned char *bytes = rsa_pkcs1_signature_string(nbytes, halg, data);
    for (size_t i = 0; i < nbytes; i++)
        diff |= bytes[nbytes-1 - i] ^ mp_get_byte(out, i);
    smemclr(bytes, nbytes);
    sfree(bytes);
    mp_free(out);

    return diff == 0;
}